

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong helper_subq_s_w_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  uint uVar2;
  DSP32Value dt;
  DSP32Value ds;
  uint uVar3;
  
  uVar3 = (uint)rs;
  uVar2 = uVar3 - (uint)rt;
  if ((int)((uVar2 ^ uVar3) & ((uint)rt ^ uVar3)) < 0) {
    uVar2 = 0x7fffffff - ((int)uVar3 >> 0x1f);
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return (long)(int)uVar2;
}

Assistant:

static inline uint32_t mipsdsp_sat32_sub(int32_t a, int32_t b,
                                         CPUMIPSState *env)
{
    int32_t  temp;

    temp = a - b;
    if (MIPSDSP_OVERFLOW_SUB(a, b, temp, 0x80000000)) {
        if (a >= 0) {
            temp = 0x7FFFFFFF;
        } else {
            temp = 0x80000000;
        }
        set_DSPControl_overflow_flag(1, 20, env);
    }

    return temp & 0xFFFFFFFFull;
}